

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblk_compr.c
# Opt level: O0

UINT8 Compress_BitPacking_8
                (UINT32 outLen,UINT8 *outData,UINT32 inLen,UINT8 *inData,PCM_CMP_INF *cmpParams)

{
  byte bVar1;
  UINT8 UVar2;
  UINT8 UVar3;
  byte bVar4;
  FUINT8 FVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  uint uVar9;
  UINT8 *pUVar10;
  short local_76;
  FUINT8 inBit;
  FUINT8 bitMask;
  FUINT8 outValB;
  FUINT8 bitWriteVal;
  FUINT8 bitsToWrite;
  UINT16 curVal;
  FUINT8 ent1Mask;
  UINT8 *ent1B;
  UINT16 ent1Count;
  FUINT8 outShift;
  FUINT8 inShift;
  FUINT8 inVal;
  UINT8 *inDataEnd;
  byte *pbStack_48;
  UINT32 inLenMax;
  UINT8 *outPos;
  UINT8 *inPos;
  FUINT8 addVal;
  FUINT8 bitsCmp;
  PCM_CMP_INF *cmpParams_local;
  UINT8 *inData_local;
  UINT32 inLen_local;
  UINT8 *outData_local;
  UINT32 outLen_local;
  
  bVar1 = cmpParams->bitsCmp;
  uVar6 = (ushort)bVar1;
  uVar8 = cmpParams->baseVal & 0xff;
  uVar7 = (ushort)(1 << (cmpParams->bitsDec & 0x1f));
  _bitWriteVal = (UINT8 *)0x0;
  if (cmpParams->subType == '\x02') {
    if (cmpParams->comprTbl->valueCount == 0) {
      return '\x10';
    }
    if ((cmpParams->bitsDec != cmpParams->comprTbl->bitsDec) ||
       (cmpParams->bitsCmp != cmpParams->comprTbl->bitsCmp)) {
      return '\x11';
    }
    _bitWriteVal = (UINT8 *)malloc((ulong)uVar7);
    GenerateReverseLUT_8
              (uVar7,_bitWriteVal,cmpParams->comprTbl->valueCount,(cmpParams->comprTbl->values).d8);
  }
  ent1B._2_2_ = 0;
  UVar2 = cmpParams->bitsDec;
  uVar9 = SUB164((ZEXT416(outLen) << 3) / ZEXT216(uVar6),0);
  inData_local._4_4_ = inLen;
  if (uVar9 < inLen) {
    inData_local._4_4_ = uVar9;
  }
  pUVar10 = inData + inData_local._4_4_;
  UVar3 = cmpParams->subType;
  pbStack_48 = outData;
  outPos = inData;
  if (UVar3 == '\0') {
    for (; outPos < pUVar10; outPos = outPos + 1) {
      bVar1 = *outPos;
      local_76 = 0;
      *pbStack_48 = *pbStack_48 & ((byte)(0xff >> ((byte)ent1B._2_2_ & 0x1f)) ^ 0xff);
      inBit = uVar6;
      while (inBit != 0) {
        FVar5 = inBit;
        if (7 < inBit) {
          FVar5 = 8;
        }
        inBit = inBit - FVar5;
        uVar7 = (ushort)((int)(uint)(ushort)(bVar1 - uVar8) >> ((byte)local_76 & 0x1f)) &
                (short)(1 << ((byte)FVar5 & 0x1f)) - 1U;
        ent1B._2_2_ = ent1B._2_2_ + FVar5;
        *pbStack_48 = *pbStack_48 | (byte)((int)((uint)uVar7 << 8) >> ((byte)ent1B._2_2_ & 0x1f));
        if (7 < ent1B._2_2_) {
          ent1B._2_2_ = ent1B._2_2_ - 8;
          pbStack_48 = pbStack_48 + 1;
          *pbStack_48 = (byte)((int)((uint)uVar7 << 8) >> ((byte)ent1B._2_2_ & 0x1f));
        }
        local_76 = local_76 + FVar5;
      }
    }
  }
  else if (UVar3 == '\x01') {
    for (; outPos < pUVar10; outPos = outPos + 1) {
      bVar4 = *outPos;
      local_76 = 0;
      *pbStack_48 = *pbStack_48 & ((byte)(0xff >> ((byte)ent1B._2_2_ & 0x1f)) ^ 0xff);
      inBit = uVar6;
      while (inBit != 0) {
        FVar5 = inBit;
        if (7 < inBit) {
          FVar5 = 8;
        }
        inBit = inBit - FVar5;
        uVar7 = (ushort)((int)((int)((uint)bVar4 - (uint)uVar8) >> (UVar2 - bVar1 & 0x1f) & 0xffffU)
                        >> ((byte)local_76 & 0x1f)) & (short)(1 << ((byte)FVar5 & 0x1f)) - 1U;
        ent1B._2_2_ = ent1B._2_2_ + FVar5;
        *pbStack_48 = *pbStack_48 | (byte)((int)((uint)uVar7 << 8) >> ((byte)ent1B._2_2_ & 0x1f));
        if (7 < ent1B._2_2_) {
          ent1B._2_2_ = ent1B._2_2_ - 8;
          pbStack_48 = pbStack_48 + 1;
          *pbStack_48 = (byte)((int)((uint)uVar7 << 8) >> ((byte)ent1B._2_2_ & 0x1f));
        }
        local_76 = local_76 + FVar5;
      }
    }
  }
  else if (UVar3 == '\x02') {
    for (; outPos < pUVar10; outPos = outPos + 1) {
      for (bitMask = 0;
          (bitMask < cmpParams->comprTbl->valueCount &&
          (*outPos != (cmpParams->comprTbl->values).d8[bitMask])); bitMask = bitMask + 1) {
      }
      local_76 = 0;
      *pbStack_48 = *pbStack_48 & ((byte)(0xff >> ((byte)ent1B._2_2_ & 0x1f)) ^ 0xff);
      inBit = uVar6;
      while (inBit != 0) {
        FVar5 = inBit;
        if (7 < inBit) {
          FVar5 = 8;
        }
        inBit = inBit - FVar5;
        uVar8 = (ushort)((int)(uint)bitMask >> ((byte)local_76 & 0x1f)) &
                (short)(1 << ((byte)FVar5 & 0x1f)) - 1U;
        ent1B._2_2_ = ent1B._2_2_ + FVar5;
        *pbStack_48 = *pbStack_48 | (byte)((int)((uint)uVar8 << 8) >> ((byte)ent1B._2_2_ & 0x1f));
        if (7 < ent1B._2_2_) {
          ent1B._2_2_ = ent1B._2_2_ - 8;
          pbStack_48 = pbStack_48 + 1;
          *pbStack_48 = (byte)((int)((uint)uVar8 << 8) >> ((byte)ent1B._2_2_ & 0x1f));
        }
        local_76 = local_76 + FVar5;
      }
    }
  }
  if (_bitWriteVal != (UINT8 *)0x0) {
    free(_bitWriteVal);
  }
  return '\0';
}

Assistant:

static UINT8 Compress_BitPacking_8(UINT32 outLen, UINT8* outData, UINT32 inLen, const UINT8* inData, const PCM_CMP_INF* cmpParams)
{
	FUINT8 bitsCmp;
	FUINT8 addVal;
	const UINT8* inPos;
	UINT8* outPos;
	UINT32 inLenMax;
	const UINT8* inDataEnd;
	FUINT8 inVal;
	FUINT8 inShift;
	FUINT8 outShift;
	UINT16 ent1Count;
	UINT8* ent1B;
	FUINT8 ent1Mask;
	UINT16 curVal;
	
	// ReadBits Variables
	FUINT8 bitsToWrite;
	FUINT8 bitWriteVal;
	FUINT8 outValB;
	FUINT8 bitMask;
	FUINT8 inBit;
	
	// --- Bit Packing compression --- (8 bit input)
	bitsCmp = cmpParams->bitsCmp;
	addVal = cmpParams->baseVal & 0xFF;
	ent1Count = 1 << cmpParams->bitsDec;
	ent1Mask = (FUINT8)(ent1Count - 1);
	ent1B = NULL;
	if (cmpParams->subType == 0x02)
	{
		ent1B = cmpParams->comprTbl->values.d8;
		if (! cmpParams->comprTbl->valueCount)
		{
			return 0x10;	// Error: no table loaded
		}
		else if (cmpParams->bitsDec != cmpParams->comprTbl->bitsDec ||
			cmpParams->bitsCmp != cmpParams->comprTbl->bitsCmp)
		{
			return 0x11;	// Data block and loaded value table incompatible
		}
		ent1B = (UINT8*)malloc(ent1Count * sizeof(UINT8));
		GenerateReverseLUT_8(ent1Count, ent1B, cmpParams->comprTbl->valueCount, cmpParams->comprTbl->values.d8);
	}
	
	outShift = 0;
	inShift = cmpParams->bitsDec - bitsCmp;
	inLenMax = MUL_DIV(outLen, 8, bitsCmp);
	if (inLen > inLenMax)
		inLen = inLenMax;
	inDataEnd = inData + inLen;
	
	switch(cmpParams->subType)
	{
	case 0x00:	// Copy
		for (inPos = inData, outPos = outData; inPos < inDataEnd; inPos += 0x01)
		{
			inVal = *inPos - addVal;
			WRITE_BITS(outPos, inVal, outShift, bitsCmp);
		}
		break;
	case 0x01:	// Shift Left
		for (inPos = inData, outPos = outData; inPos < inDataEnd; inPos += 0x01)
		{
			inVal = (*inPos - addVal) >> inShift;
			WRITE_BITS(outPos, inVal, outShift, bitsCmp);
		}
		break;
	case 0x02:	// Table
		for (inPos = inData, outPos = outData; inPos < inDataEnd; inPos += 0x01)
		{
#if 1
			for (curVal = 0x00; curVal < cmpParams->comprTbl->valueCount; curVal ++)
			{
				if (*inPos == cmpParams->comprTbl->values.d8[curVal])
					break;
			}
			inVal = (FUINT8)curVal;
#else
			inVal = ent1B[*inPos & ent1Mask];
#endif
			WRITE_BITS(outPos, inVal, outShift, bitsCmp);
		}
		break;
	}
	if (ent1B != NULL)
		free(ent1B);
	
	return 0x00;
}